

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O1

PropertySpecSyntax * __thiscall slang::parsing::Parser::parsePropertySpec(Parser *this)

{
  bool bVar1;
  TimingControlSyntax *clocking;
  ExpressionSyntax *expr;
  DisableIffSyntax *disable;
  PropertyExprSyntax *expr_00;
  PropertySpecSyntax *pPVar2;
  Token disable_00;
  Token iff;
  Token openParen;
  Token closeParen;
  
  bVar1 = ParserBase::peek(&this->super_ParserBase,At);
  if (bVar1) {
    clocking = parseTimingControl(this,true);
  }
  else {
    clocking = (TimingControlSyntax *)0x0;
  }
  bVar1 = ParserBase::peek(&this->super_ParserBase,DisableKeyword);
  if (bVar1) {
    disable_00 = ParserBase::consume(&this->super_ParserBase);
    iff = ParserBase::expect(&this->super_ParserBase,IffKeyword);
    openParen = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
    expr = parseExpressionOrDist(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0);
    closeParen = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
    disable = slang::syntax::SyntaxFactory::disableIff
                        (&this->factory,disable_00,iff,openParen,expr,closeParen);
  }
  else {
    disable = (DisableIffSyntax *)0x0;
  }
  expr_00 = parsePropertyExpr(this,0);
  pPVar2 = slang::syntax::SyntaxFactory::propertySpec(&this->factory,clocking,disable,expr_00);
  return pPVar2;
}

Assistant:

PropertySpecSyntax& Parser::parsePropertySpec() {
    TimingControlSyntax* timing = nullptr;
    if (peek(TokenKind::At))
        timing = parseTimingControl(/* inAssertion */ true);

    DisableIffSyntax* disable = nullptr;
    if (peek(TokenKind::DisableKeyword)) {
        auto keyword = consume();
        auto iff = expect(TokenKind::IffKeyword);
        auto openParen = expect(TokenKind::OpenParenthesis);
        auto& expr = parseExpressionOrDist();
        disable = &factory.disableIff(keyword, iff, openParen, expr,
                                      expect(TokenKind::CloseParenthesis));
    }

    return factory.propertySpec(timing, disable, parsePropertyExpr(0));
}